

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O3

void pnga_bin_index(Integer g_bin,Integer g_cnt,Integer g_off,Integer *values,Integer *subs,
                   Integer n,Integer sortit)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  size_t icode;
  ulong icode_00;
  void *pvVar6;
  long lVar7;
  void *pvVar8;
  int len;
  int left;
  int right;
  Integer nbin;
  int root;
  int lenmes;
  int up;
  Integer type;
  Integer ndim;
  long local_c8;
  uint local_bc;
  void *local_b8;
  size_t local_b0;
  long local_a8;
  int local_a0;
  int local_9c;
  void *local_98;
  long local_90;
  Integer *local_88;
  Integer local_80;
  Integer local_78;
  Integer local_70;
  long local_68;
  Integer local_60;
  Integer *local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  local_88 = values;
  local_80 = g_bin;
  local_78 = g_off;
  local_60 = g_cnt;
  pnga_inquire(g_bin,&local_40,&local_38,(Integer *)&local_b0);
  if (local_38 != 1) {
    pnga_error("ga_bin_index: 1-dim array required",local_38);
  }
  if ((0xf < local_40 - 0x3e9U) || ((0x8003UL >> (local_40 - 0x3e9U & 0x3f) & 1) == 0)) {
    pnga_error("ga_bin_index: not integer type",local_40);
  }
  icode = local_b0;
  local_b8 = calloc(local_b0,4);
  if (local_b8 == (void *)0x0) {
    pnga_error("ga_binning:calloc failed",icode);
    icode = local_b0;
  }
  local_98 = malloc(icode * 4);
  if (local_98 == (void *)0x0) {
    pnga_error("ga_binning:malloc failed",icode);
  }
  if (0 < n) {
    lVar7 = 0;
    do {
      lVar3 = subs[lVar7];
      uVar5 = (uint)lVar3;
      if (((int)uVar5 < 1) || ((long)local_b0 < (long)(ulong)(uVar5 & 0x7fffffff))) {
        pnga_error("wrong bin",(long)(int)uVar5);
      }
      piVar1 = (int *)((long)local_b8 + ((lVar3 << 0x20) + -0x100000000 >> 0x1e));
      *piVar1 = *piVar1 + 1;
      lVar7 = lVar7 + 1;
    } while (n != lVar7);
  }
  local_70 = n;
  local_58 = subs;
  if (0 < (long)local_b0) {
    local_48 = 0;
    local_68 = 0;
    pvVar6 = local_98;
    pvVar8 = local_b8;
    do {
      uVar5 = (int)local_b0 - (int)local_48;
      if (local_48 + 2000 < local_b0) {
        uVar5 = 2000;
      }
      icode_00 = (ulong)uVar5;
      local_50 = local_48;
      local_48 = local_48 + 2000;
      local_a0 = armci_msg_me();
      if (local_b8 == (void *)0x0) {
        pnga_error("sgai_bin_offset: NULL pointer",(long)(int)uVar5);
      }
      if (2000 < (int)uVar5) {
        pnga_error("sgai_bin_offset: >NWORK",icode_00);
      }
      len = uVar5 * 4;
      armci_msg_bintree(0x14d,(int *)&local_a8,(int *)&local_90,(int *)&local_c8,(int *)&local_bc);
      if (-1 < (int)(uint)local_c8) {
        armci_msg_rcv(0x7d64,workL,len,&local_9c,(uint)local_c8);
      }
      if ((int)local_bc < 0) {
        if ((int)(uint)local_c8 < 0) goto LAB_0013ac05;
LAB_0013abe7:
        if (0 < (int)uVar5) {
          uVar4 = 0;
          do {
            workL[uVar4] = workL[uVar4] + *(int *)((long)pvVar8 + uVar4 * 4);
            uVar4 = uVar4 + 1;
          } while (icode_00 != uVar4);
        }
      }
      else {
        armci_msg_rcv(0x7d64,workR,len,&local_9c,local_bc);
        if ((int)(local_bc | (uint)local_c8) < 0) {
          if (-1 < (int)(uint)local_c8) goto LAB_0013abe7;
LAB_0013ac05:
          if (0 < (int)uVar5) {
            memcpy(workL,(void *)(local_68 * 8000 + (long)local_b8),icode_00 << 2);
          }
        }
        else if (0 < (int)uVar5) {
          uVar4 = 0;
          do {
            workL[uVar4] = workL[uVar4] + *(int *)((long)pvVar8 + uVar4 * 4) + workR[uVar4];
            uVar4 = uVar4 + 1;
          } while (icode_00 != uVar4);
        }
      }
      if ((int)local_90 != -1 && local_a0 != (int)local_a8) {
        armci_msg_snd(0x7d64,workL,len,(int)local_90);
      }
      if ((int)local_90 != -1 && local_a0 != (int)local_a8) {
        armci_msg_rcv(0x7d64,workL,len,&local_9c,(int)local_90);
      }
      if (0 < (int)uVar5) {
        uVar4 = 0;
        do {
          *(int *)((long)pvVar6 + uVar4 * 4) = workL[uVar4] - *(int *)((long)pvVar8 + uVar4 * 4);
          uVar4 = uVar4 + 1;
        } while (icode_00 != uVar4);
      }
      if (-1 < (int)local_bc) {
        armci_msg_snd(0x7d64,(void *)((long)local_98 + local_50 * 4),len,local_bc);
      }
      if (-1 < (int)(uint)local_c8) {
        if (0 < (int)uVar5) {
          uVar4 = 0;
          do {
            workR[uVar4] = *(int *)((long)pvVar6 + uVar4 * 4) - workR[uVar4];
            uVar4 = uVar4 + 1;
          } while (icode_00 != uVar4);
        }
        armci_msg_snd(0x7d64,workR,len,(uint)local_c8);
      }
      local_68 = local_68 + 1;
      pvVar8 = (void *)((long)pvVar8 + 8000);
      pvVar6 = (void *)((long)pvVar6 + 8000);
    } while ((long)local_48 < (long)local_b0);
  }
  if (0 < local_70) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      local_c8 = local_58[lVar7];
      uVar2 = *(uint *)((long)local_b8 + local_c8 * 4 + -4);
      pnga_get(local_78,&local_c8,&local_c8,&local_a8,&local_c8);
      lVar3 = (long)*(int *)((long)local_98 + local_c8 * 4 + -4);
      local_90 = lVar3 + local_a8;
      local_a8 = local_a8 + lVar3 + 1;
      local_90 = local_90 + (int)uVar2;
      if ((long)local_b0 < local_a8) {
        printf("Writing off end of bins array: index=%d elems=%d lo=%ld hi=%ld values=%ld nbin=%ld\n"
               ,(ulong)uVar5,(ulong)uVar2,local_a8,local_90,lVar7 + (long)local_88,local_b0);
        break;
      }
      pnga_put(local_80,&local_a8,&local_90,local_88 + lVar7,&local_c8);
      uVar5 = uVar5 + uVar2;
      lVar7 = (long)(int)uVar5;
    } while (lVar7 < local_70);
  }
  free(local_98);
  free(local_b8);
  if (sortit == 0) {
    pnga_sync();
  }
  else {
    pnga_bin_sorter(local_80,local_60,local_78);
  }
  return;
}

Assistant:

void pnga_bin_index(Integer g_bin, Integer g_cnt, Integer g_off, 
                   Integer *values, Integer *subs, Integer n, Integer sortit)
{
int i, my_nbin=0;
int *all_bin_contrib, *offset;
Integer type, ndim, nbin;

    pnga_inquire(g_bin, &type, &ndim, &nbin);
    if(ndim !=1) pnga_error("ga_bin_index: 1-dim array required",ndim);
    if(type!= C_INT && type!=C_LONG && type!=C_LONGLONG)
       pnga_error("ga_bin_index: not integer type",type);

    all_bin_contrib = (int*)calloc(nbin,sizeof(int));
    if(!all_bin_contrib)pnga_error("ga_binning:calloc failed",nbin);
    offset = (int*)malloc(nbin*sizeof(int));
    if(!offset)pnga_error("ga_binning:malloc failed",nbin);

    /* count how many elements go to each bin */
    for(i=0; i< n; i++){
       int selected = subs[i];
       if(selected <1 || selected> nbin) pnga_error("wrong bin",selected);

       if(all_bin_contrib[selected-1] ==0) my_nbin++; /* new bin found */
       all_bin_contrib[selected-1]++;
    }

    /* process bins in chunks to match available buffer space */
    for(i=0; i<nbin; i+=NWORK){
        int cnbin = ((i+NWORK)<nbin) ? NWORK: nbin -i;
        sgai_bin_offset(SCOPE_ALL, all_bin_contrib+i, cnbin, offset+i);
    }

    for(i=0; i< n; ){
       Integer lo, hi;
       Integer selected = subs[i];
       int elems = all_bin_contrib[selected-1];

       pnga_get(g_off,&selected,&selected, &lo, &selected);
       lo += offset[selected-1]+1;
       hi = lo + elems -1;
/*
       printf("%d: elems=%d lo=%d sel=%d off=%d contrib=%d nbin=%d\n",pnga_nodeid(), elems, lo, selected,offset[selected-1],all_bin_contrib[0],nbin);
*/
       if(lo > nbin) {
	      printf("Writing off end of bins array: index=%d elems=%d lo=%ld hi=%ld values=%ld nbin=%ld\n",
                i,elems,(long)lo,(long)hi,(long)values+i,(long)nbin);
         break;   
       }else{
          pnga_put(g_bin, &lo, &hi, values+i, &selected); 
       }
       i+=elems;
    }
    
    free(offset);
    free(all_bin_contrib);

    if(sortit)pnga_bin_sorter(g_bin, g_cnt, g_off);
    else pnga_sync();
}